

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeTemperamentEqual(MidiMessage *this,int referencePitchClass,int channelMask)

{
  allocator<double> local_39;
  value_type_conflict3 local_38;
  undefined1 local_30 [8];
  vector<double,_std::allocator<double>_> temperament;
  int channelMask_local;
  int referencePitchClass_local;
  MidiMessage *this_local;
  
  local_38 = 0.0;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = channelMask;
  temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = referencePitchClass;
  std::allocator<double>::allocator(&local_39);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_30,0xc,&local_38,&local_39);
  std::allocator<double>::~allocator(&local_39);
  makeMts9_TemperamentByCentsDeviationFromET
            (this,(vector<double,_std::allocator<double>_> *)local_30,
             temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)temperament.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_30);
  return;
}

Assistant:

void MidiMessage::makeTemperamentEqual(int referencePitchClass, int channelMask) {
	std::vector<double> temperament(12, 0.0);
	this->makeMts9_TemperamentByCentsDeviationFromET(temperament, referencePitchClass, channelMask);
}